

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall Darts::Details::DoubleArrayBuilder::expand_units(DoubleArrayBuilder *this)

{
  id_type next;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  extra_type *peVar4;
  ulong uVar5;
  extra_type *this_00;
  DoubleArrayBuilder *in_RDI;
  id_type i;
  size_t id;
  id_type dest_num_blocks;
  id_type dest_num_units;
  id_type src_num_blocks;
  id_type src_num_units;
  size_t in_stack_ffffffffffffffc8;
  id_type id_00;
  id_type in_stack_ffffffffffffffdc;
  id_type iVar6;
  DoubleArrayBuilder *in_stack_ffffffffffffffe0;
  
  sVar2 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::size(&in_RDI->units_);
  next = (id_type)sVar2;
  sVar3 = num_blocks((DoubleArrayBuilder *)0x47c9ba);
  uVar1 = (int)sVar3 + 1;
  if (0x10 < uVar1) {
    fix_block(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  AutoPool<Darts::Details::DoubleArrayBuilderUnit>::resize
            ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)in_RDI,in_stack_ffffffffffffffc8);
  iVar6 = next;
  if (0x10 < uVar1) {
    for (uVar5 = sVar2 & 0xffffffff; uVar5 < next + 0x100; uVar5 = uVar5 + 1) {
      peVar4 = extras(in_RDI,(id_type)(in_stack_ffffffffffffffc8 >> 0x20));
      DoubleArrayBuilderExtraUnit::set_is_used(peVar4,false);
      peVar4 = extras(in_RDI,(id_type)(in_stack_ffffffffffffffc8 >> 0x20));
      DoubleArrayBuilderExtraUnit::set_is_fixed(peVar4,false);
    }
  }
  while( true ) {
    iVar6 = iVar6 + 1;
    id_00 = (id_type)(in_stack_ffffffffffffffc8 >> 0x20);
    if (next + 0x100 <= iVar6) break;
    peVar4 = extras(in_RDI,id_00);
    DoubleArrayBuilderExtraUnit::set_next(peVar4,iVar6);
    peVar4 = extras(in_RDI,(id_type)(in_stack_ffffffffffffffc8 >> 0x20));
    DoubleArrayBuilderExtraUnit::set_prev(peVar4,iVar6 - 1);
  }
  peVar4 = extras(in_RDI,id_00);
  DoubleArrayBuilderExtraUnit::set_prev(peVar4,next + 0xff);
  peVar4 = extras(in_RDI,id_00);
  DoubleArrayBuilderExtraUnit::set_next(peVar4,next);
  peVar4 = extras(in_RDI,id_00);
  this_00 = extras(in_RDI,(id_type)((ulong)peVar4 >> 0x20));
  iVar6 = DoubleArrayBuilderExtraUnit::prev(this_00);
  DoubleArrayBuilderExtraUnit::set_prev(peVar4,iVar6);
  iVar6 = (id_type)((ulong)peVar4 >> 0x20);
  peVar4 = extras(in_RDI,iVar6);
  DoubleArrayBuilderExtraUnit::set_next(peVar4,in_RDI->extras_head_);
  peVar4 = extras(in_RDI,iVar6);
  DoubleArrayBuilderExtraUnit::prev(peVar4);
  peVar4 = extras(in_RDI,iVar6);
  DoubleArrayBuilderExtraUnit::set_next(peVar4,next);
  peVar4 = extras(in_RDI,iVar6);
  DoubleArrayBuilderExtraUnit::set_prev(peVar4,next + 0xff);
  return;
}

Assistant:

inline void DoubleArrayBuilder::expand_units() {
  id_type src_num_units = units_.size();
  id_type src_num_blocks = num_blocks();

  id_type dest_num_units = src_num_units + BLOCK_SIZE;
  id_type dest_num_blocks = src_num_blocks + 1;

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    fix_block(src_num_blocks - NUM_EXTRA_BLOCKS);
  }

  units_.resize(dest_num_units);

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    for (std::size_t id = src_num_units; id < dest_num_units; ++id) {
      extras(id).set_is_used(false);
      extras(id).set_is_fixed(false);
    }
  }

  for (id_type i = src_num_units + 1; i < dest_num_units; ++i) {
    extras(i - 1).set_next(i);
    extras(i).set_prev(i - 1);
  }

  extras(src_num_units).set_prev(dest_num_units - 1);
  extras(dest_num_units - 1).set_next(src_num_units);

  extras(src_num_units).set_prev(extras(extras_head_).prev());
  extras(dest_num_units - 1).set_next(extras_head_);

  extras(extras(extras_head_).prev()).set_next(src_num_units);
  extras(extras_head_).set_prev(dest_num_units - 1);
}